

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

void __thiscall
pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
          (accessor<pybind11::detail::accessor_policies::str_attr> *this,char (*value) [213])

{
  handle obj;
  char *key;
  object local_18;
  
  obj.m_ptr = (this->obj).m_ptr;
  key = this->key;
  local_18.super_handle = type_caster<char,_void>::cast(*value,copy,(handle)0x0);
  accessor_policies::str_attr::set(obj,key,local_18.super_handle);
  object::~object(&local_18);
  return;
}

Assistant:

void operator=(T &&value) && {
        Policy::set(obj, key, object_or_cast(std::forward<T>(value)));
    }